

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall
tinygltf::OcclusionTextureInfo::OcclusionTextureInfo
          (OcclusionTextureInfo *this,OcclusionTextureInfo *param_1)

{
  double dVar1;
  int iVar2;
  
  iVar2 = param_1->texCoord;
  dVar1 = param_1->strength;
  this->index = param_1->index;
  this->texCoord = iVar2;
  this->strength = dVar1;
  Value::Value(&this->extras,&param_1->extras);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->extensions)._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

OcclusionTextureInfo() = default;